

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsImplications.cpp
# Opt level: O2

bool __thiscall
HighsImplications::runProbing(HighsImplications *this,HighsInt col,HighsInt *numReductions)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  HighsMipSolverData *pHVar5;
  pointer pIVar6;
  HighsMipSolverData *pHVar7;
  pointer pHVar8;
  int iVar9;
  bool bVar10;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *pvVar11;
  long lVar12;
  pointer pHVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  pointer pHVar17;
  ulong uVar18;
  int iVar19;
  HighsInt implcol;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  HighsDomainChange boundchg;
  HighsDomainChange boundchg_00;
  bool local_a9;
  ulong local_a8;
  long local_a0;
  int *local_98;
  HighsDomain *local_90;
  ulong local_88;
  vector<HighsSubstitution,_std::allocator<HighsSubstitution>_> *local_80;
  double local_78;
  double local_70;
  long local_68;
  long local_60;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *local_58;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *local_50;
  HighsSubstitution substitution;
  
  pHVar5 = (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  bVar10 = HighsDomain::isBinary(&pHVar5->domain,col);
  if (((bVar10) &&
      (pIVar6 = (this->implications).
                super__Vector_base<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>
                ._M_impl.super__Vector_impl_data._M_start, pIVar6[col * 2 + 1].computed == false))
     && (pIVar6[col * 2].computed == false)) {
    pHVar7 = (this->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    lVar15 = (long)col;
    lVar12 = (long)*(int *)(*(long *)&(pHVar7->cliquetable).colsubstituted.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl +
                           lVar15 * 4);
    if ((lVar12 == 0) ||
       (*(long *)&(pHVar7->cliquetable).substitutions.
                  super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                  ._M_impl + lVar12 * 8 == 8)) {
      local_98 = numReductions;
      local_90 = &pHVar5->domain;
      bVar10 = computeImplications(this,col,true);
      if ((!bVar10) && ((pHVar5->domain).infeasible_ == false)) {
        pHVar7 = (this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
        lVar12 = (long)*(int *)(*(long *)&(pHVar7->cliquetable).colsubstituted.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl +
                               lVar15 * 4);
        if ((((lVar12 == 0) ||
             (*(long *)&(pHVar7->cliquetable).substitutions.
                        super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                        ._M_impl + lVar12 * 8 == 8)) &&
            (local_a9 = computeImplications(this,col,false), !local_a9)) &&
           ((pHVar5->domain).infeasible_ == false)) {
          pHVar7 = (this->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
          lVar12 = (long)*(int *)(*(long *)&(pHVar7->cliquetable).colsubstituted.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                 lVar15 * 4);
          if ((lVar12 == 0) ||
             (*(long *)&(pHVar7->cliquetable).substitutions.
                        super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                        ._M_impl + lVar12 * 8 == 8)) {
            iVar14 = 0;
            pvVar11 = getImplications(this,col,false,&local_a9);
            local_58 = getImplications(this,col,true,&local_a9);
            local_a8 = (ulong)((long)(pvVar11->
                                     super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar11->
                                    super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 4;
            local_88 = (ulong)((long)(local_58->
                                     super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_58->
                                    super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 4;
            local_80 = &this->substitutions;
            local_60 = (long)(int)local_a8;
            local_68 = (long)(int)local_88;
            iVar19 = 0;
            uVar18 = local_a8;
            local_50 = pvVar11;
LAB_002ae7e9:
            do {
              do {
                while( true ) {
                  while( true ) {
                    if ((int)local_88 <= iVar19) {
                      return true;
                    }
                    if ((int)uVar18 <= iVar14) {
                      return true;
                    }
                    lVar12 = (long)iVar19;
                    pHVar13 = (local_58->
                              super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    uVar4 = pHVar13[lVar12].column;
                    lVar15 = (long)iVar14;
                    pHVar17 = (local_50->
                              super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    iVar16 = pHVar17[lVar15].column;
                    if (iVar16 <= (int)uVar4) break;
                    iVar19 = iVar19 + 1;
                  }
                  if ((int)uVar4 <= iVar16) break;
                  iVar14 = iVar14 + 1;
                }
                local_a0 = (long)(int)uVar4;
                dVar2 = *(double *)
                         (*(long *)&(pHVar5->domain).col_lower_.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl +
                         local_a0 * 8);
                dVar22 = *(double *)
                          (*(long *)&(pHVar5->domain).col_upper_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl +
                          local_a0 * 8);
                pHVar17 = pHVar17 + lVar15;
                dVar20 = dVar2;
                dVar24 = dVar22;
                do {
                  lVar15 = lVar15 + 1;
                  dVar3 = pHVar17->boundval;
                  dVar23 = dVar20;
                  dVar25 = dVar24;
                  if (pHVar17->boundtype == kLower) {
                    dVar23 = dVar3;
                    if (dVar3 <= dVar20) {
                      dVar23 = dVar20;
                    }
                  }
                  else {
                    dVar25 = dVar3;
                    if (dVar24 <= dVar3) {
                      dVar25 = dVar24;
                    }
                  }
                  if (local_60 <= lVar15) {
                    iVar14 = (int)local_a8;
                    break;
                  }
                  iVar14 = iVar14 + 1;
                  pHVar8 = pHVar17 + 1;
                  pHVar17 = pHVar17 + 1;
                  dVar20 = dVar23;
                  dVar24 = dVar25;
                } while (pHVar8->column == uVar4);
                iVar16 = iVar19 + 1;
                if (iVar19 + 1 <= (int)local_88) {
                  iVar16 = (int)local_88;
                }
                pHVar13 = pHVar13 + lVar12;
                dVar20 = dVar2;
                dVar24 = dVar22;
                do {
                  lVar12 = lVar12 + 1;
                  dVar3 = pHVar13->boundval;
                  dVar21 = dVar20;
                  dVar26 = dVar24;
                  if (pHVar13->boundtype == kLower) {
                    dVar21 = dVar3;
                    if (dVar3 <= dVar20) {
                      dVar21 = dVar20;
                    }
                  }
                  else {
                    dVar26 = dVar3;
                    if (dVar24 <= dVar3) {
                      dVar26 = dVar24;
                    }
                  }
                  iVar9 = iVar16;
                  if (local_68 <= lVar12) break;
                  iVar19 = iVar19 + 1;
                  pHVar17 = pHVar13 + 1;
                  pHVar13 = pHVar13 + 1;
                  dVar20 = dVar21;
                  dVar24 = dVar26;
                  iVar9 = iVar19;
                } while (pHVar17->column == uVar4);
                iVar19 = iVar9;
                uVar18 = local_a8;
              } while ((this->colsubstituted).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start[local_a0] != '\0');
            } while ((dVar2 == dVar22) && (!NAN(dVar2) && !NAN(dVar22)));
            if (((dVar23 != dVar25) ||
                (((NAN(dVar23) || NAN(dVar25) || (dVar21 != dVar26)) || (NAN(dVar21) || NAN(dVar26))
                 ))) || (pdVar1 = &((this->mipsolver->mipdata_)._M_t.
                                    super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                    .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl
                                   )->feastol,
                        ABS(dVar23 - dVar21) < *pdVar1 || ABS(dVar23 - dVar21) == *pdVar1))
            goto LAB_002ae99f;
            substitution.scale = dVar21 - dVar23;
            substitution.substcol = uVar4;
            substitution.staycol = col;
            substitution.offset = dVar23;
            std::vector<HighsSubstitution,_std::allocator<HighsSubstitution>_>::push_back
                      (local_80,&substitution);
            (this->colsubstituted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            ._M_impl.super__Vector_impl_data._M_start[local_a0] = '\x01';
            goto LAB_002aea23;
          }
        }
      }
      return true;
    }
  }
  return false;
LAB_002ae99f:
  if (dVar23 <= dVar21) {
    dVar21 = dVar23;
  }
  if (dVar2 < dVar21) {
    boundchg.column = uVar4;
    boundchg.boundval = dVar21;
    boundchg.boundtype = kLower;
    local_78 = dVar26;
    local_70 = dVar25;
    HighsDomain::changeBound(local_90,boundchg,(Reason)0xfffffffe);
    *local_98 = *local_98 + 1;
    dVar22 = *(double *)
              (*(long *)&(pHVar5->domain).col_upper_.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl + local_a0 * 8)
    ;
    dVar25 = local_70;
    dVar26 = local_78;
  }
  if (dVar26 <= dVar25) {
    dVar26 = dVar25;
  }
  uVar18 = local_a8;
  if (dVar26 < dVar22) {
    boundchg_00._8_8_ = (ulong)uVar4 + 0x100000000;
    boundchg_00.boundval = dVar26;
    HighsDomain::changeBound(local_90,boundchg_00,(Reason)0xfffffffe);
LAB_002aea23:
    *local_98 = *local_98 + 1;
    uVar18 = local_a8;
  }
  goto LAB_002ae7e9;
}

Assistant:

bool HighsImplications::runProbing(HighsInt col, HighsInt& numReductions) {
  HighsDomain& globaldomain = mipsolver.mipdata_->domain;
  if (globaldomain.isBinary(col) && !implicationsCached(col, 1) &&
      !implicationsCached(col, 0) &&
      mipsolver.mipdata_->cliquetable.getSubstitution(col) == nullptr) {
    bool infeasible;

    infeasible = computeImplications(col, 1);
    if (globaldomain.infeasible()) return true;
    if (infeasible) return true;
    if (mipsolver.mipdata_->cliquetable.getSubstitution(col) != nullptr)
      return true;

    infeasible = computeImplications(col, 0);
    if (globaldomain.infeasible()) return true;
    if (infeasible) return true;
    if (mipsolver.mipdata_->cliquetable.getSubstitution(col) != nullptr)
      return true;

    // analyze implications
    const std::vector<HighsDomainChange>& implicsdown =
        getImplications(col, 0, infeasible);
    const std::vector<HighsDomainChange>& implicsup =
        getImplications(col, 1, infeasible);
    HighsInt nimplicsdown = implicsdown.size();
    HighsInt nimplicsup = implicsup.size();
    HighsInt u = 0;
    HighsInt d = 0;

    while (u < nimplicsup && d < nimplicsdown) {
      if (implicsup[u].column < implicsdown[d].column)
        ++u;
      else if (implicsdown[d].column < implicsup[u].column)
        ++d;
      else {
        assert(implicsup[u].column == implicsdown[d].column);
        HighsInt implcol = implicsup[u].column;
        double lbDown = globaldomain.col_lower_[implcol];
        double ubDown = globaldomain.col_upper_[implcol];
        double lbUp = lbDown;
        double ubUp = ubDown;

        do {
          if (implicsdown[d].boundtype == HighsBoundType::kLower)
            lbDown = std::max(lbDown, implicsdown[d].boundval);
          else
            ubDown = std::min(ubDown, implicsdown[d].boundval);
          ++d;
        } while (d < nimplicsdown && implicsdown[d].column == implcol);

        do {
          if (implicsup[u].boundtype == HighsBoundType::kLower)
            lbUp = std::max(lbUp, implicsup[u].boundval);
          else
            ubUp = std::min(ubUp, implicsup[u].boundval);
          ++u;
        } while (u < nimplicsup && implicsup[u].column == implcol);

        if (colsubstituted[implcol] || globaldomain.isFixed(implcol)) continue;

        if (lbDown == ubDown && lbUp == ubUp &&
            std::abs(lbDown - lbUp) > mipsolver.mipdata_->feastol) {
          HighsSubstitution substitution;
          substitution.substcol = implcol;
          substitution.staycol = col;
          substitution.offset = lbDown;
          substitution.scale = lbUp - lbDown;
          substitutions.push_back(substitution);
          colsubstituted[implcol] = true;
          ++numReductions;
        } else {
          double lb = std::min(lbDown, lbUp);
          double ub = std::max(ubDown, ubUp);

          if (lb > globaldomain.col_lower_[implcol]) {
            globaldomain.changeBound(HighsBoundType::kLower, implcol, lb,
                                     HighsDomain::Reason::unspecified());
            ++numReductions;
          }

          if (ub < globaldomain.col_upper_[implcol]) {
            globaldomain.changeBound(HighsBoundType::kUpper, implcol, ub,
                                     HighsDomain::Reason::unspecified());
            ++numReductions;
          }
        }
      }
    }

    return true;
  }

  return false;
}